

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

int64_t __thiscall flexbuffers::Reference::AsInt64(Reference *this)

{
  byte bVar1;
  double *pdVar2;
  int iVar3;
  int *piVar4;
  size_t *psVar5;
  size_t sVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  char *endptr;
  uint8_t *local_38;
  Vector local_30;
  
  sVar6 = 0;
  switch(this->type_) {
  case FBT_UINT:
    psVar5 = (size_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (ulong)(byte)*psVar5;
      }
      return (ulong)(ushort)*psVar5;
    }
    if (bVar1 < 8) {
      return (ulong)(uint)*psVar5;
    }
    goto LAB_00147995;
  case FBT_FLOAT:
    pdVar2 = (double *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)pdVar2;
      }
      else {
        iVar3 = (int)*(short *)pdVar2;
      }
LAB_001479f3:
      dVar10 = (double)iVar3;
    }
    else if (bVar1 < 8) {
      dVar10 = (double)*(float *)pdVar2;
    }
    else {
      dVar10 = *pdVar2;
    }
    goto LAB_001479f7;
  case FBT_KEY:
  case FBT_MAP:
    break;
  case FBT_STRING:
    AsString((String *)&local_30,this);
    if (local_30.super_Sized.super_Object.data_ == (uint8_t *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                   );
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_38 = local_30.super_Sized.super_Object.data_;
    sVar6 = strtoll_l((char *)local_30.super_Sized.super_Object.data_,(char **)&local_38,10,
                      flatbuffers::ClassicLocale::instance_);
    if (((local_38 == local_30.super_Sized.super_Object.data_) || (*local_38 != '\0')) ||
       (*piVar4 != 0)) {
      sVar6 = 0;
    }
    break;
  case FBT_INDIRECT_INT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (long)*(char *)((long)puVar7 + lVar9);
      }
      return (long)*(short *)((long)puVar7 + lVar9);
    }
    if (bVar1 < 8) {
      return (long)*(int *)((long)puVar7 + lVar9);
    }
    goto LAB_00147a6a;
  case FBT_INDIRECT_UINT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (ulong)*(byte *)((long)puVar7 + lVar9);
      }
      return (ulong)*(ushort *)((long)puVar7 + lVar9);
    }
    if (bVar1 < 8) {
      return (ulong)*(uint *)((long)puVar7 + lVar9);
    }
LAB_00147a6a:
    sVar6 = *(size_t *)((long)puVar7 + lVar9);
    break;
  case FBT_INDIRECT_FLOAT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)((long)puVar7 + lVar9);
      }
      else {
        iVar3 = (int)*(short *)((long)puVar7 + lVar9);
      }
      goto LAB_001479f3;
    }
    if (bVar1 < 8) {
      dVar10 = (double)*(float *)((long)puVar7 + lVar9);
    }
    else {
      dVar10 = *(double *)((long)puVar7 + lVar9);
    }
LAB_001479f7:
    sVar6 = (size_t)dVar10;
    break;
  case FBT_VECTOR:
    AsVector(&local_30,this);
    sVar6 = local_30.super_Sized.size_;
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0;
    }
  case FBT_INT:
    psVar5 = (size_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        sVar6 = (long)(char)(byte)*psVar5;
      }
      else {
        sVar6 = (long)(short)(ushort)*psVar5;
      }
    }
    else if (bVar1 < 8) {
      sVar6 = (long)(int)(uint)*psVar5;
    }
    else {
LAB_00147995:
      sVar6 = *psVar5;
    }
  }
  return sVar6;
}

Assistant:

int64_t AsInt64() const {
    if (type_ == FBT_INT) {
      // A fast path for the common case.
      return ReadInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_UINT: return ReadUInt64(data_, parent_width_);
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<int64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<int64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<int64_t>(AsVector().size());
        case FBT_BOOL: return ReadInt64(data_, parent_width_);
        default:
          // Convert other things to int.
          return 0;
      }
  }